

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_gtest_tests.cpp
# Opt level: O0

void __thiscall
test::syntax_gtest_tests::iu_GTestSyntaxTest_x_iutest_x_GT_Test::
~iu_GTestSyntaxTest_x_iutest_x_GT_Test(iu_GTestSyntaxTest_x_iutest_x_GT_Test *this)

{
  iu_GTestSyntaxTest_x_iutest_x_GT_Test *this_local;
  
  ~iu_GTestSyntaxTest_x_iutest_x_GT_Test(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

TEST(GTestSyntaxTest, GT)
{
    if( int x = 1 )
        ASSERT_GT(2, x) << x;
    if( int x = 1 )
        EXPECT_GT(2, x) << x;
    if( int x = 1 )
        INFORM_GT(2, x) << x;
    if( int x = 1 )
        ASSUME_GT(2, x) << x;
}